

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::doRemoveRow(SPxSolverBase<double> *this,int i)

{
  SPxStatus SVar1;
  
  SPxLPBase<double>::doRemoveRow(&this->super_SPxLPBase<double>,i);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
  if ((this->super_SPxBasisBase<double>).thestatus < SINGULAR) {
    return;
  }
  SPxBasisBase<double>::removedRow(&this->super_SPxBasisBase<double>,i);
  SVar1 = (this->super_SPxBasisBase<double>).thestatus;
  if (SVar1 != INFEASIBLE) {
    if (SVar1 == OPTIMAL) {
      if (this->m_status == OPTIMAL) {
        this->m_status = UNKNOWN;
      }
      if ((this->super_SPxBasisBase<double>).thestatus == PRIMAL) {
        return;
      }
      (this->super_SPxBasisBase<double>).thestatus = PRIMAL;
      return;
    }
    if (SVar1 != DUAL) {
      return;
    }
  }
  if (this->m_status == OPTIMAL) {
    this->m_status = UNKNOWN;
  }
  if ((this->super_SPxBasisBase<double>).thestatus != REGULAR) {
    (this->super_SPxBasisBase<double>).thestatus = REGULAR;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::doRemoveRow(int i)
{

   SPxLPBase<R>::doRemoveRow(i);

   unInit();

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      this->removedRow(i);

      switch(SPxBasisBase<R>::status())
      {
      case SPxBasisBase<R>::DUAL:
      case SPxBasisBase<R>::INFEASIBLE:
         setBasisStatus(SPxBasisBase<R>::REGULAR);
         break;

      case SPxBasisBase<R>::OPTIMAL:
         setBasisStatus(SPxBasisBase<R>::PRIMAL);
         break;

      default:
         break;
      }
   }
}